

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O2

bool is_bin(string *str)

{
  bool bVar1;
  
  bVar1 = std::operator==(str,"+");
  if (!bVar1) {
    bVar1 = std::operator==(str,"-");
    if (!bVar1) {
      bVar1 = std::operator==(str,"*");
      if (!bVar1) {
        bVar1 = std::operator==(str,"/");
        if (!bVar1) {
          bVar1 = std::operator==(str,"^");
          return bVar1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool is_bin (const string& str) {
    return str == "+" || str == "-" || str == "*" || str == "/" || str == "^";
}